

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

maybe<(anonymous_namespace)::enumeration,_void> * __thiscall
pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>::operator()
          (maybe<(anonymous_namespace)::enumeration,_void> *__return_storage_ptr__,
          parser<(anonymous_namespace)::enumeration,_void> *this,string *v)

{
  bool bVar1;
  const_iterator __first;
  pointer plVar2;
  enumeration local_54;
  string *local_50;
  literal *local_48;
  literal *local_40;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  local_38;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  it;
  const_iterator end;
  const_iterator begin;
  string *v_local;
  parser<(anonymous_namespace)::enumeration,_void> *this_local;
  
  __first = parser_base::begin(&this->super_parser_base);
  local_48 = (literal *)parser_base::end(&this->super_parser_base);
  local_50 = v;
  local_40 = __first._M_current;
  it._M_current = local_48;
  local_38 = std::operator()(__first._M_current,
                             (__normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
                              )local_48,(anon_class_8_1_54a39816_for__M_pred)v);
  bVar1 = __gnu_cxx::operator==(&local_38,&it);
  if (bVar1) {
    nothing<(anonymous_namespace)::enumeration>();
  }
  else {
    plVar2 = __gnu_cxx::
             __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
             ::operator->(&local_38);
    local_54 = plVar2->value;
    just<(anonymous_namespace)::enumeration>(__return_storage_ptr__,&local_54);
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<T> operator() (std::string const & v) const {
                auto begin = this->begin ();
                auto end = this->end ();
                auto it =
                    std::find_if (begin, end, [&v] (literal const & lit) { return v == lit.name; });
                if (it == end) {
                    return nothing<T> ();
                }
                return just (T (it->value));
            }